

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextReader.cpp
# Opt level: O1

void __thiscall TextFileReader::NextBuffer(TextFileReader *this)

{
  int iVar1;
  size_t sVar2;
  
  if (this->mGzFile == (gzFile)0x0) {
    sVar2 = read(this->mFd,this->mBuffer,this->mTotalBufferSize);
  }
  else {
    iVar1 = gzread(this->mGzFile,this->mBuffer,(int)this->mTotalBufferSize);
    sVar2 = (size_t)iVar1;
  }
  this->mBufferSize = sVar2;
  this->mBufferPos = 0;
  return;
}

Assistant:

void TextFileReader::NextBuffer() {
#ifdef USE_ZLIB
  if( mGzFile ) {
    mBufferSize = gzread( mGzFile, mBuffer, mTotalBufferSize );
  } else
#endif
  {
    mBufferSize = read( mFd, mBuffer, mTotalBufferSize );
  }

  mBufferPos = 0;
}